

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O1

int __thiscall QGenericItemModel::rowCount(QGenericItemModel *this,QModelIndex *parent)

{
  long in_FS_OFFSET;
  int ret;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = 0;
  (*(code *)**(undefined8 **)(this + 0x10))(3,*(undefined8 **)(this + 0x10),&local_14);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

int QGenericItemModel::rowCount(const QModelIndex &parent) const
{
    return impl->callConst<int>(QGenericItemModelImplBase::RowCount, parent);
}